

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_record.c
# Opt level: O3

_Bool load_local_record(cacheset *cacheset,char *filename)

{
  uint size;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int *piVar3;
  uint uVar4;
  cacheset *Cache;
  int iVar5;
  int iVar6;
  uint uVar7;
  IP IP;
  char ip [32];
  char buffer [630];
  char name [513];
  uint local_50c;
  ip local_4f8;
  undefined1 local_4e8;
  char local_4d8 [32];
  short local_4b8 [320];
  char local_238 [520];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x15,"file open error:%s",pcVar2);
  }
  else {
    pcVar2 = fgets((char *)local_4b8,0x276,__stream);
    uVar7 = 0;
    if (pcVar2 != (char *)0x0) {
      do {
        uVar7 = uVar7 + (local_4b8[0] != 10);
        pcVar2 = fgets((char *)local_4b8,0x276,__stream);
      } while (pcVar2 != (char *)0x0);
    }
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x1d,"read %d lines",(ulong)uVar7);
    rewind(__stream);
    if (uVar7 == 0) {
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
              ,0x39,"v4 = %d,v6 = %d,black=%d",0,0,0);
      rewind(__stream);
    }
    else {
      iVar5 = uVar7 * -2;
      iVar6 = 0;
      local_50c = 0;
      size = 0;
      uVar4 = uVar7;
      do {
        iVar1 = __isoc99_fscanf(__stream,"%s%s",local_4d8,local_238);
        if (iVar1 == 2) {
          iVar1 = inet_pton(2,local_4d8,&local_4f8);
          if (iVar1 == 1) {
            if (local_4f8.field_0.v4 == 0) {
LAB_001049a8:
              iVar6 = iVar6 + 1;
            }
            else {
              size = size + 1;
            }
          }
          else {
            iVar1 = inet_pton(10,local_4d8,&local_4f8);
            if (iVar1 == 1) {
              if (CONCAT44(local_4f8._4_4_,local_4f8.field_0.v4) == 0 && local_4f8._8_8_ == 0)
              goto LAB_001049a8;
              log_log(2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
                      ,0x2f,"-------------%s",local_4d8);
              local_50c = local_50c + 1;
            }
          }
          uVar4 = uVar4 - 1;
          if (uVar4 == 0) break;
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
              ,0x39,"v4 = %d,v6 = %d,black=%d",(ulong)size,(ulong)local_50c,iVar6);
      if (0 < (int)size) {
        init_staticCache(&(cacheset->A).local,size);
      }
      if (0 < (int)local_50c) {
        init_staticCache(&(cacheset->A).local,local_50c);
      }
      if (0 < iVar6) {
        init_staticCache(&cacheset->blacklist,iVar6);
      }
      rewind(__stream);
      if (uVar7 != 0) {
        iVar6 = uVar7 * -2;
        do {
          iVar5 = __isoc99_fscanf(__stream,"%s%s",local_4d8,local_238);
          if (iVar5 == 2) {
            iVar5 = inet_pton(2,local_4d8,&local_4f8);
            if (iVar5 == 1) {
              local_4e8 = 4;
              Cache = (cacheset *)&(cacheset->A).local;
              if (local_4f8.field_0.v4 == 0) {
LAB_00104aee:
                Cache = cacheset;
              }
LAB_00104af3:
              set_static_cache(&Cache->blacklist,local_238,(IP *)&local_4f8);
            }
            else {
              iVar5 = inet_pton(10,local_4d8,&local_4f8);
              if (iVar5 == 1) {
                local_4e8 = 6;
                Cache = (cacheset *)&(cacheset->AAAA).local;
                if (CONCAT44(local_4f8._4_4_,local_4f8.field_0.v4) == 0 && local_4f8._8_8_ == 0)
                goto LAB_00104aee;
                goto LAB_00104af3;
              }
            }
            uVar7 = uVar7 - 1;
            if (uVar7 == 0) break;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
      }
    }
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x5b,"read local record done");
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool load_local_record(struct cacheset *cacheset,const char* filename){
    char buffer[630];
    char name[513];
    char ip[32];
    struct IP IP;
    FILE* file;
    int line=0,_line;
    int v4 = 0,v6 = 0,black=0;
    int sizeofip = sizeof(struct IP);

    if( (file =fopen(filename,"r"))==NULL){
        log_error("file open error:%s",strerror(errno));
        return false;
    }
    while (fgets(buffer, 630, file)){
        if(strcmp(buffer,"\n")){
            line++; // 非空行
        }
    }
    log_info("read %d lines",line);

    // 首先扫一遍，确定个数
    rewind(file);
    _line = line;
    int _ = _line*2;//防止无限循环
    while(_--){
        if (fscanf(file, "%s%s",ip,name)==2){
            if (inet_pton(AF_INET,ip,&IP.addr)==1){
                if(IP.addr.v4 == 0){
                    black++;
                }else{
                    v4++;
                }
            }else if (inet_pton(PF_INET6,ip,&IP.addr)==1){
                 if(IP.addr.v6==0){
                    black++;
                }else{
                    log_info("-------------%s",ip);
                    v6++;
                }
            }
            _line--;
            if(_line==0)break;
        }
    }


    log_info("v4 = %d,v6 = %d,black=%d",v4,v6,black);
    // 初始化集合
    if(v4>0){
        init_staticCache(&cacheset->A.local,v4);
    }
    if(v6>0){
        init_staticCache(&cacheset->A.local,v6);
    }
    if(black>0){
        init_staticCache(&cacheset->blacklist,black);
    }
    rewind(file);
     _ = line*2;//防止无限循环
    while(_--){
        if (fscanf(file, "%s%s",ip,name)==2){
            if (inet_pton(AF_INET,ip,&IP.addr)==1){
                IP.type = IPV4;
                if(IP.addr.v4==0){
                    set_static_cache(&cacheset->blacklist,name,&IP);
                }else{
                    set_static_cache(&cacheset->A.local,name,&IP);
                }
            }else if (inet_pton(PF_INET6,ip,&IP.addr)==1){
                IP.type = IPV6;
                 if(IP.addr.v6==0){
                    set_static_cache(&cacheset->blacklist,name,&IP);
                }else{
                    set_static_cache(&cacheset->AAAA.local,name,&IP);
                }
            }
            line--;
            if(line==0)break;
        }
    }
    log_info("read local record done");
    return true;
}